

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O3

void __thiscall
HashtableAllTest_LoadFactor_Test<google::HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_LoadFactor_Test<google::HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  iterator iVar1;
  int iVar2;
  int iVar3;
  pointer piVar4;
  float grow;
  float fVar5;
  size_t bucket_count;
  float shrink_threshold;
  pair<google::sparse_hashtable_iterator<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_bool>
  r;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *local_150;
  int local_148;
  TransparentHasher local_140;
  float local_134;
  undefined4 local_130 [3];
  float local_124;
  pair<google::sparse_hashtable_iterator<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_bool>
  local_120;
  undefined **local_d0;
  sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_c8;
  
  local_134 = 0.2;
  do {
    local_140.super_Hasher.id_ = 0;
    local_140.super_Hasher.num_hashes_ = 0;
    local_140.super_Hasher.num_compares_ = 0;
    local_150 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_148 = 0;
    local_120.first.ht._0_4_ = 0;
    local_120.first.pos.row_begin._M_current =
         (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *
         )0x0;
    local_d0 = &PTR__BaseHashtableInterface_00c16f18;
    google::
    sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::sparse_hashtable(&local_c8,0,&local_140,(TransparentHasher *)&local_150,
                       (Negation<int> *)local_130,(SetKey<int,_Negation<int>_> *)&local_124,
                       (Alloc<int,_unsigned_long,_18446744073709551615UL> *)&local_120);
    local_d0 = &PTR__BaseHashtableInterface_00c16e98;
    iVar2 = UniqueObjectHelper<int>(1);
    google::
    sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::squash_deleted(&local_c8);
    local_c8.key_info.delkey = -iVar2;
    local_c8.settings.super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
    use_deleted_ = true;
    local_c8.settings.super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
    shrink_factor_ = local_134 * 0.5;
    local_c8.settings.super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
    enlarge_factor_ = local_134;
    fVar5 = local_134 * (float)local_c8.table.settings.table_size;
    local_c8.settings.super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
    enlarge_threshold_ = (size_type)fVar5;
    local_c8.settings.super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
    enlarge_threshold_ =
         (long)(fVar5 - 9.223372e+18) &
         (long)local_c8.settings.
               super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
               enlarge_threshold_ >> 0x3f |
         local_c8.settings.super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
         enlarge_threshold_;
    if (0.0 <= local_c8.settings.
               super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.shrink_factor_)
    {
      local_c8.settings.super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
      shrink_factor_ = 0.0;
    }
    fVar5 = local_c8.settings.super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
            shrink_factor_ * (float)local_c8.table.settings.table_size;
    local_c8.settings.super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
    shrink_threshold_ = (size_type)fVar5;
    local_c8.settings.super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
    shrink_threshold_ =
         (long)(fVar5 - 9.223372e+18) &
         (long)local_c8.settings.
               super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
               shrink_threshold_ >> 0x3f |
         local_c8.settings.super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
         shrink_threshold_;
    local_c8.settings.super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
    consider_shrink_ = false;
    local_140.super_Hasher.id_ = (int)local_134;
    testing::internal::CmpHelperEQ<float,float>
              ((internal *)&local_120,"grow_threshold","ht.max_load_factor()",&local_134,
               (float *)&local_140);
    if ((char)local_120.first.ht == '\0') {
      testing::Message::Message((Message *)&local_140);
      piVar4 = (pointer)0xaf1463;
      if (local_120.first.pos.row_begin._M_current !=
          (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
           *)0x0) {
        piVar4 = (local_120.first.pos.row_begin._M_current)->group;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_150,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
                 ,0x269,(char *)piVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_150,(Message *)&local_140);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_150);
      if ((long *)local_140.super_Hasher._0_8_ != (long *)0x0) {
        (**(code **)(*(long *)local_140.super_Hasher._0_8_ + 8))();
      }
    }
    iVar1._M_current = local_120.first.pos.row_begin._M_current;
    if (local_120.first.pos.row_begin._M_current !=
        (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
        0x0) {
      if ((int **)(local_120.first.pos.row_begin._M_current)->group !=
          &((local_120.first.pos.row_begin._M_current)->settings).
           super_alloc_impl<Alloc<int,_unsigned_long,_18446744073709551615UL>_>.
           super_Alloc<int,_unsigned_long,_18446744073709551615UL>.count_) {
        operator_delete((local_120.first.pos.row_begin._M_current)->group);
      }
      operator_delete(iVar1._M_current);
    }
    local_140.super_Hasher._0_8_ = (long *)0x0;
    local_150 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                CONCAT44(local_150._4_4_,
                         local_c8.settings.
                         super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
                         shrink_factor_);
    testing::internal::CmpHelperEQ<double,float>
              ((internal *)&local_120,"0.0","ht.min_load_factor()",(double *)&local_140,
               (float *)&local_150);
    if ((char)local_120.first.ht == '\0') {
      testing::Message::Message((Message *)&local_140);
      piVar4 = (pointer)0xaf1463;
      if (local_120.first.pos.row_begin._M_current !=
          (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
           *)0x0) {
        piVar4 = (local_120.first.pos.row_begin._M_current)->group;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_150,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
                 ,0x26a,(char *)piVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_150,(Message *)&local_140);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_150);
      if ((long *)local_140.super_Hasher._0_8_ != (long *)0x0) {
        (**(code **)(*(long *)local_140.super_Hasher._0_8_ + 8))();
      }
    }
    iVar1._M_current = local_120.first.pos.row_begin._M_current;
    if (local_120.first.pos.row_begin._M_current !=
        (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
        0x0) {
      if ((int **)(local_120.first.pos.row_begin._M_current)->group !=
          &((local_120.first.pos.row_begin._M_current)->settings).
           super_alloc_impl<Alloc<int,_unsigned_long,_18446744073709551615UL>_>.
           super_Alloc<int,_unsigned_long,_18446744073709551615UL>.count_) {
        operator_delete((local_120.first.pos.row_begin._M_current)->group);
      }
      operator_delete(iVar1._M_current);
    }
    google::
    sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::resize(&local_c8,0x4098);
    local_140.super_Hasher.id_ = (undefined4)local_c8.table.settings.table_size;
    local_140.super_Hasher.num_hashes_ = local_c8.table.settings.table_size._4_4_;
    iVar2 = UniqueObjectHelper<int>(2);
    local_150 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                CONCAT44(local_150._4_4_,iVar2);
    google::
    sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::resize_delta(&local_c8,1);
    google::
    sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::insert_noresize(&local_120,&local_c8,(const_reference)&local_150);
    local_120.first.ht._0_4_ = UniqueObjectHelper<int>(2);
    local_120.first.ht._0_4_ = -(int)local_120.first.ht;
    google::
    sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::erase(&local_c8,(key_type *)&local_120);
    iVar2 = 2;
    while( true ) {
      iVar3 = UniqueObjectHelper<int>(iVar2);
      local_150 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  CONCAT44(local_150._4_4_,iVar3);
      google::
      sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
      ::resize_delta(&local_c8,1);
      google::
      sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
      ::insert_noresize(&local_120,&local_c8,(const_reference)&local_150);
      if (local_134 <=
          (float)(local_c8.table.settings.num_buckets - local_c8.num_deleted) /
          (float)(ulong)local_140.super_Hasher._0_8_) break;
      local_150 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_c8.table.settings.table_size;
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                ((internal *)&local_120,"bucket_count","ht.bucket_count()",
                 (unsigned_long *)&local_140,(unsigned_long *)&local_150);
      if ((char)local_120.first.ht == '\0') {
        testing::Message::Message((Message *)&local_150);
        piVar4 = (pointer)0xaf1463;
        if (local_120.first.pos.row_begin._M_current !=
            (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
             *)0x0) {
          piVar4 = (local_120.first.pos.row_begin._M_current)->group;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)local_130,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
                   ,0x275,(char *)piVar4);
        testing::internal::AssertHelper::operator=((AssertHelper *)local_130,(Message *)&local_150);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_130);
        if (local_150 !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_150 + 8))();
        }
      }
      iVar1._M_current = local_120.first.pos.row_begin._M_current;
      if (local_120.first.pos.row_begin._M_current !=
          (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
           *)0x0) {
        if ((int **)(local_120.first.pos.row_begin._M_current)->group !=
            &((local_120.first.pos.row_begin._M_current)->settings).
             super_alloc_impl<Alloc<int,_unsigned_long,_18446744073709551615UL>_>.
             super_Alloc<int,_unsigned_long,_18446744073709551615UL>.count_) {
          operator_delete((local_120.first.pos.row_begin._M_current)->group);
        }
        operator_delete(iVar1._M_current);
      }
      iVar2 = iVar2 + 1;
    }
    local_150 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                local_c8.table.settings.table_size;
    testing::internal::CmpHelperGT<unsigned_long,unsigned_long>
              ((internal *)&local_120,"ht.bucket_count()","bucket_count",(unsigned_long *)&local_150
               ,(unsigned_long *)&local_140);
    if ((char)local_120.first.ht == '\0') {
      testing::Message::Message((Message *)&local_150);
      piVar4 = (pointer)0xaf1463;
      if (local_120.first.pos.row_begin._M_current !=
          (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
           *)0x0) {
        piVar4 = (local_120.first.pos.row_begin._M_current)->group;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_130,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
                 ,0x277,(char *)piVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_130,(Message *)&local_150);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_130);
      if (local_150 !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_150 + 8))();
      }
    }
    iVar1._M_current = local_120.first.pos.row_begin._M_current;
    if (local_120.first.pos.row_begin._M_current !=
        (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
        0x0) {
      if ((int **)(local_120.first.pos.row_begin._M_current)->group !=
          &((local_120.first.pos.row_begin._M_current)->settings).
           super_alloc_impl<Alloc<int,_unsigned_long,_18446744073709551615UL>_>.
           super_Alloc<int,_unsigned_long,_18446744073709551615UL>.count_) {
        operator_delete((local_120.first.pos.row_begin._M_current)->group);
      }
      operator_delete(iVar1._M_current);
    }
    fVar5 = (float)local_c8.table.settings.table_size;
    local_124 = (float)(local_c8.table.settings.num_buckets - local_c8.num_deleted) / fVar5 + -0.01;
    local_c8.settings.super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
    shrink_factor_ = 0.5;
    if (local_124 <= 0.5) {
      local_c8.settings.super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
      shrink_factor_ = local_124;
    }
    local_c8.settings.super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
    enlarge_factor_ = 1.0;
    local_c8.settings.super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
    enlarge_threshold_ = (long)(fVar5 - 9.223372e+18) & (long)fVar5 >> 0x3f | (long)fVar5;
    local_c8.settings.super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
    shrink_threshold_ =
         (size_type)
         (local_c8.settings.super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
          shrink_factor_ * fVar5);
    local_c8.settings.super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
    shrink_threshold_ =
         (long)(local_c8.settings.
                super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.shrink_factor_
                * fVar5 - 9.223372e+18) &
         (long)local_c8.settings.
               super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
               shrink_threshold_ >> 0x3f |
         local_c8.settings.super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
         shrink_threshold_;
    local_c8.settings.super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
    consider_shrink_ = false;
    local_150 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                &DAT_3ff0000000000000;
    local_130[0] = 0x3f800000;
    testing::internal::CmpHelperEQ<double,float>
              ((internal *)&local_120,"1.0","ht.max_load_factor()",(double *)&local_150,
               (float *)local_130);
    if ((char)local_120.first.ht == '\0') {
      testing::Message::Message((Message *)&local_150);
      piVar4 = (pointer)0xaf1463;
      if (local_120.first.pos.row_begin._M_current !=
          (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
           *)0x0) {
        piVar4 = (local_120.first.pos.row_begin._M_current)->group;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_130,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
                 ,0x282,(char *)piVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_130,(Message *)&local_150);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_130);
      if (local_150 !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_150 + 8))();
      }
    }
    iVar1._M_current = local_120.first.pos.row_begin._M_current;
    if (local_120.first.pos.row_begin._M_current !=
        (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
        0x0) {
      if ((int **)(local_120.first.pos.row_begin._M_current)->group !=
          &((local_120.first.pos.row_begin._M_current)->settings).
           super_alloc_impl<Alloc<int,_unsigned_long,_18446744073709551615UL>_>.
           super_Alloc<int,_unsigned_long,_18446744073709551615UL>.count_) {
        operator_delete((local_120.first.pos.row_begin._M_current)->group);
      }
      operator_delete(iVar1._M_current);
    }
    local_150 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                CONCAT44(local_150._4_4_,
                         local_c8.settings.
                         super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
                         shrink_factor_);
    testing::internal::CmpHelperEQ<float,float>
              ((internal *)&local_120,"shrink_threshold","ht.min_load_factor()",&local_124,
               (float *)&local_150);
    if ((char)local_120.first.ht == '\0') {
      testing::Message::Message((Message *)&local_150);
      piVar4 = (pointer)0xaf1463;
      if (local_120.first.pos.row_begin._M_current !=
          (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
           *)0x0) {
        piVar4 = (local_120.first.pos.row_begin._M_current)->group;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_130,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
                 ,0x283,(char *)piVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_130,(Message *)&local_150);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_130);
      if (local_150 !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_150 + 8))();
      }
    }
    iVar1._M_current = local_120.first.pos.row_begin._M_current;
    if (local_120.first.pos.row_begin._M_current !=
        (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
        0x0) {
      if ((int **)(local_120.first.pos.row_begin._M_current)->group !=
          &((local_120.first.pos.row_begin._M_current)->settings).
           super_alloc_impl<Alloc<int,_unsigned_long,_18446744073709551615UL>_>.
           super_Alloc<int,_unsigned_long,_18446744073709551615UL>.count_) {
        operator_delete((local_120.first.pos.row_begin._M_current)->group);
      }
      operator_delete(iVar1._M_current);
    }
    local_140.super_Hasher.id_ = (undefined4)local_c8.table.settings.table_size;
    local_140.super_Hasher.num_hashes_ = local_c8.table.settings.table_size._4_4_;
    iVar2 = 2;
    while( true ) {
      local_120.first.ht._0_4_ = UniqueObjectHelper<int>(iVar2);
      local_120.first.ht._0_4_ = -(int)local_120.first.ht;
      google::
      sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
      ::erase(&local_c8,(key_type *)&local_120);
      iVar2 = iVar2 + 1;
      local_120.first.ht._0_4_ = UniqueObjectHelper<int>(iVar2);
      local_120.first.ht._0_4_ = -(int)local_120.first.ht;
      google::
      sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
      ::erase(&local_c8,(key_type *)&local_120);
      iVar3 = UniqueObjectHelper<int>(iVar2);
      local_150 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  CONCAT44(local_150._4_4_,iVar3);
      google::
      sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
      ::resize_delta(&local_c8,1);
      google::
      sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
      ::insert_noresize(&local_120,&local_c8,(const_reference)&local_150);
      if ((float)(local_c8.table.settings.num_buckets - local_c8.num_deleted) /
          (float)(ulong)local_140.super_Hasher._0_8_ <= local_124) break;
      local_150 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_c8.table.settings.table_size;
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                ((internal *)&local_120,"bucket_count","ht.bucket_count()",
                 (unsigned_long *)&local_140,(unsigned_long *)&local_150);
      if ((char)local_120.first.ht == '\0') {
        testing::Message::Message((Message *)&local_150);
        piVar4 = (pointer)0xaf1463;
        if (local_120.first.pos.row_begin._M_current !=
            (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
             *)0x0) {
          piVar4 = (local_120.first.pos.row_begin._M_current)->group;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)local_130,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
                   ,0x28e,(char *)piVar4);
        testing::internal::AssertHelper::operator=((AssertHelper *)local_130,(Message *)&local_150);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_130);
        if (local_150 !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_150 + 8))();
        }
      }
      iVar1._M_current = local_120.first.pos.row_begin._M_current;
      if (local_120.first.pos.row_begin._M_current !=
          (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
           *)0x0) {
        if ((int **)(local_120.first.pos.row_begin._M_current)->group !=
            &((local_120.first.pos.row_begin._M_current)->settings).
             super_alloc_impl<Alloc<int,_unsigned_long,_18446744073709551615UL>_>.
             super_Alloc<int,_unsigned_long,_18446744073709551615UL>.count_) {
          operator_delete((local_120.first.pos.row_begin._M_current)->group);
        }
        operator_delete(iVar1._M_current);
      }
    }
    local_150 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                local_c8.table.settings.table_size;
    testing::internal::CmpHelperLT<unsigned_long,unsigned_long>
              ((internal *)&local_120,"ht.bucket_count()","bucket_count",(unsigned_long *)&local_150
               ,(unsigned_long *)&local_140);
    if ((char)local_120.first.ht == '\0') {
      testing::Message::Message((Message *)&local_150);
      piVar4 = (pointer)0xaf1463;
      if (local_120.first.pos.row_begin._M_current !=
          (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
           *)0x0) {
        piVar4 = (local_120.first.pos.row_begin._M_current)->group;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_130,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
                 ,0x290,(char *)piVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_130,(Message *)&local_150);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_130);
      if (local_150 !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_150 + 8))();
      }
    }
    iVar1._M_current = local_120.first.pos.row_begin._M_current;
    if (local_120.first.pos.row_begin._M_current !=
        (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
        0x0) {
      if ((int **)(local_120.first.pos.row_begin._M_current)->group !=
          &((local_120.first.pos.row_begin._M_current)->settings).
           super_alloc_impl<Alloc<int,_unsigned_long,_18446744073709551615UL>_>.
           super_Alloc<int,_unsigned_long,_18446744073709551615UL>.count_) {
        operator_delete((local_120.first.pos.row_begin._M_current)->group);
      }
      operator_delete(iVar1._M_current);
    }
    local_d0 = &PTR__BaseHashtableInterface_00c16f18;
    std::
    vector<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
    ::~vector(&local_c8.table.groups);
    local_134 = local_134 + 0.2;
  } while (local_134 <= 0.8);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, LoadFactor) {
  const typename TypeParam::size_type kSize = 16536;
  // Check growing past various thresholds and then shrinking below
  // them.
  for (float grow_threshold = 0.2f; grow_threshold <= 0.8f;
       grow_threshold += 0.2f) {
    TypeParam ht;
    ht.set_deleted_key(this->UniqueKey(1));
    ht.max_load_factor(grow_threshold);
    ht.min_load_factor(0.0);
    EXPECT_EQ(grow_threshold, ht.max_load_factor());
    EXPECT_EQ(0.0, ht.min_load_factor());

    ht.resize(kSize);
    size_t bucket_count = ht.bucket_count();
    // Erase and insert an element to set consider_shrink = true,
    // which should not cause a shrink because the threshold is 0.0.
    ht.insert(this->UniqueObject(2));
    ht.erase(this->UniqueKey(2));
    for (int i = 2;; ++i) {
      ht.insert(this->UniqueObject(i));
      if (static_cast<float>(ht.size()) / bucket_count < grow_threshold) {
        EXPECT_EQ(bucket_count, ht.bucket_count());
      } else {
        EXPECT_GT(ht.bucket_count(), bucket_count);
        break;
      }
    }
    // Now set a shrink threshold 1% below the current size and remove
    // items until the size falls below that.
    const float shrink_threshold =
        static_cast<float>(ht.size()) / ht.bucket_count() - 0.01f;

    // This time around, check the old set_resizing_parameters interface.
    ht.set_resizing_parameters(shrink_threshold, 1.0);
    EXPECT_EQ(1.0, ht.max_load_factor());
    EXPECT_EQ(shrink_threshold, ht.min_load_factor());

    bucket_count = ht.bucket_count();
    for (int i = 2;; ++i) {
      ht.erase(this->UniqueKey(i));
      // A resize is only triggered by an insert, so add and remove a
      // value every iteration to trigger the shrink as soon as the
      // threshold is passed.
      ht.erase(this->UniqueKey(i + 1));
      ht.insert(this->UniqueObject(i + 1));
      if (static_cast<float>(ht.size()) / bucket_count > shrink_threshold) {
        EXPECT_EQ(bucket_count, ht.bucket_count());
      } else {
        EXPECT_LT(ht.bucket_count(), bucket_count);
        break;
      }
    }
  }
}